

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

void __thiscall LatencySimulator::clear(LatencySimulator *this)

{
  DelayTunnel *pDVar1;
  DelayTunnel *pDVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  pDVar1 = &this->p12;
  for (p_Var4 = (this->p12).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)pDVar1;
      p_Var4 = p_Var4->_M_next) {
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 8))();
    }
  }
  pDVar2 = &this->p21;
  for (p_Var4 = (this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)pDVar2;
      p_Var4 = p_Var4->_M_next) {
    if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 8))();
    }
  }
  p_Var4 = (pDVar1->super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>)._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)pDVar1) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var3;
  }
  (this->p12).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)pDVar1;
  (this->p12).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pDVar1;
  (this->p12).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl._M_node.
  _M_size = 0;
  p_Var4 = (this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)pDVar2) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var3;
  }
  (this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)pDVar2;
  (this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pDVar2;
  (this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl._M_node.
  _M_size = 0;
  return;
}

Assistant:

void clear() {
        DelayTunnel::iterator it;
        for (it = p12.begin(); it != p12.end(); it++) {
            delete *it;
        }
        for (it = p21.begin(); it != p21.end(); it++) {
            delete *it;
        }
        p12.clear();
        p21.clear();
    }